

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O0

int __thiscall
zmq::socket_base_t::monitor
          (socket_base_t *this,char *endpoint_,uint64_t events_,int event_version_,int type_)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  ctx_t *ctx_;
  char *addr_;
  int in_ECX;
  _func_int **in_RDX;
  long in_RSI;
  object_t *in_RDI;
  int in_R8D;
  int rc;
  int linger;
  string address;
  string protocol;
  scoped_lock_t lock;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  int type__00;
  socket_base_t *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 uVar4;
  bool local_99;
  string local_88 [32];
  string local_68 [7];
  undefined1 in_stack_ffffffffffffff9f;
  socket_base_t *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  string *in_stack_ffffffffffffffd0;
  int local_4;
  
  scoped_lock_t::scoped_lock_t
            ((scoped_lock_t *)in_stack_ffffffffffffff30,
             (mutex_t *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (((ulong)in_RDI[0x41]._vptr_object_t & 0x100000000) == 0) {
    local_99 = in_ECX == 1 && (ulong)in_RDX >> 0x10 != 0;
    if (local_99) {
      piVar3 = __errno_location();
      *piVar3 = 0x16;
      local_4 = -1;
    }
    else if (in_RSI == 0) {
      stop_monitor(in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
      local_4 = 0;
    }
    else {
      std::__cxx11::string::string(local_68);
      std::__cxx11::string::string(local_88);
      iVar2 = parse_uri((char *)CONCAT44(in_ECX,in_R8D),in_stack_ffffffffffffffd0,
                        (string *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if ((iVar2 == 0) &&
         (iVar2 = check_protocol(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30), iVar2 == 0))
      {
        bVar1 = std::operator!=(in_stack_ffffffffffffff30,
                                (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28
                                                ));
        type__00 = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
        uVar4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff48);
        if (bVar1) {
          piVar3 = __errno_location();
          *piVar3 = 0x5d;
          local_4 = -1;
        }
        else {
          if (*(long *)&in_RDI[0x44]._tid != 0) {
            stop_monitor(in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
          }
          if (((in_R8D == 0) || (in_R8D == 1)) || (in_R8D == 8)) {
            in_RDI[0x45]._vptr_object_t = in_RDX;
            *(int *)&in_RDI[0x2d]._ctx = in_ECX;
            ctx_ = object_t::get_ctx(in_RDI);
            addr_ = (char *)zmq_socket(ctx_,type__00);
            *(char **)&in_RDI[0x44]._tid = addr_;
            if (*(long *)&in_RDI[0x44]._tid == 0) {
              local_4 = -1;
            }
            else {
              iVar2 = zmq_setsockopt((void *)CONCAT44(iVar2,uVar4),in_R8D,ctx_,(size_t)addr_);
              if (iVar2 == -1) {
                stop_monitor(in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
              }
              local_4 = zmq_bind(ctx_,addr_);
              if (local_4 == -1) {
                stop_monitor(in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
              }
            }
          }
          else {
            piVar3 = __errno_location();
            *piVar3 = 0x16;
            local_4 = -1;
          }
        }
      }
      else {
        local_4 = -1;
      }
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_68);
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x9523dfd;
    local_4 = -1;
  }
  scoped_lock_t::~scoped_lock_t((scoped_lock_t *)0x20615b);
  return local_4;
}

Assistant:

int zmq::socket_base_t::monitor (const char *endpoint_,
                                 uint64_t events_,
                                 int event_version_,
                                 int type_)
{
    scoped_lock_t lock (_monitor_sync);

    if (unlikely (_ctx_terminated)) {
        errno = ETERM;
        return -1;
    }

    //  Event version 1 supports only first 16 events.
    if (unlikely (event_version_ == 1 && events_ >> 16 != 0)) {
        errno = EINVAL;
        return -1;
    }

    //  Support deregistering monitoring endpoints as well
    if (endpoint_ == NULL) {
        stop_monitor ();
        return 0;
    }
    //  Parse endpoint_uri_ string.
    std::string protocol;
    std::string address;
    if (parse_uri (endpoint_, protocol, address) || check_protocol (protocol))
        return -1;

    //  Event notification only supported over inproc://
    if (protocol != protocol_name::inproc) {
        errno = EPROTONOSUPPORT;
        return -1;
    }

    // already monitoring. Stop previous monitor before starting new one.
    if (_monitor_socket != NULL) {
        stop_monitor (true);
    }

    // Check if the specified socket type is supported. It must be a
    // one-way socket types that support the SNDMORE flag.
    switch (type_) {
        case ZMQ_PAIR:
            break;
        case ZMQ_PUB:
            break;
        case ZMQ_PUSH:
            break;
        default:
            errno = EINVAL;
            return -1;
    }

    //  Register events to monitor
    _monitor_events = events_;
    options.monitor_event_version = event_version_;
    //  Create a monitor socket of the specified type.
    _monitor_socket = zmq_socket (get_ctx (), type_);
    if (_monitor_socket == NULL)
        return -1;

    //  Never block context termination on pending event messages
    int linger = 0;
    int rc =
      zmq_setsockopt (_monitor_socket, ZMQ_LINGER, &linger, sizeof (linger));
    if (rc == -1)
        stop_monitor (false);

    //  Spawn the monitor socket endpoint
    rc = zmq_bind (_monitor_socket, endpoint_);
    if (rc == -1)
        stop_monitor (false);
    return rc;
}